

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O2

DirectPropertyMap * __thiscall
Assimp::FBX::PropertyTable::GetUnparsedProperties_abi_cxx11_
          (DirectPropertyMap *__return_storage_ptr__,PropertyTable *this)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  Property *__p;
  __shared_ptr<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Base_ptr p_Var3;
  shared_ptr<Assimp::FBX::Property> prop;
  __shared_ptr<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var3 = (this->lazyProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->lazyProps)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Property_*>_>_>
            ::find(&(this->props)._M_t,(key_type *)(p_Var3 + 1));
    if (&(this->props)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar2._M_node) {
      __p = anon_unknown_6::ReadTypedProperty(*(Element **)(p_Var3 + 2));
      std::__shared_ptr<Assimp::FBX::Property,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Assimp::FBX::Property,void>
                ((__shared_ptr<Assimp::FBX::Property,(__gnu_cxx::_Lock_policy)2> *)&local_40,__p);
      if (local_40._M_ptr != (element_type *)0x0) {
        this_00 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)(p_Var3 + 1))->
                   super___shared_ptr<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,&local_40);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DirectPropertyMap PropertyTable::GetUnparsedProperties() const
{
    DirectPropertyMap result;

    // Loop through all the lazy properties (which is all the properties)
    for(const LazyPropertyMap::value_type& element : lazyProps) {

        // Skip parsed properties
        if (props.end() != props.find(element.first)) continue;

        // Read the element's value.
        // Wrap the naked pointer (since the call site is required to acquire ownership)
        // std::unique_ptr from C++11 would be preferred both as a wrapper and a return value.
        std::shared_ptr<Property> prop = std::shared_ptr<Property>(ReadTypedProperty(*element.second));

        // Element could not be read. Skip it.
        if (!prop) continue;

        // Add to result
        result[element.first] = prop;
    }

    return result;
}